

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  char x;
  char eme [8];
  char pinkish [12];
  
  setlocale(6,"");
  builtin_strncpy(eme,"\x1b[1;36m",8);
  std::operator<<((ostream *)&std::cout,eme);
  builtin_strncpy(pinkish,"\x1b[38;5;212m",0xc);
  std::operator<<((ostream *)&std::cout,pinkish);
  poVar1 = std::operator<<((ostream *)&std::cout,"Para cada alternativa digite: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"(n) para o rebelde Nietzsche.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"(s) para o realista shopenhauer.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"(k) para o moralista Kant.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"(h) para o institucionalista Hegel.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  if (x == 'h') {
    pcVar2 = anon_var_dwarf_939;
  }
  else if (x == 'k') {
    pcVar2 = anon_var_dwarf_923;
  }
  else if (x == 's') {
    pcVar2 = anon_var_dwarf_90d;
  }
  else if (x == 'n') {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_8e1);
    pcVar2 = "Uma ponte sob o abismo!!!";
  }
  else {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_943);
    pcVar2 = anon_var_dwarf_959;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
  setlocale(LC_ALL, "");
  char eme[] = {0x1b, '[', '1', ';', '3', '6', 'm', 0};
  cout << eme;

  const char n = 'n';
  const char s = 's';
  const char k = 'k';
  const char h = 'h';
  char x;
  char pinkish[] = { 0x1b, '[', '3', '8',';','5',';','2','1','2','m',0 };
  cout << pinkish;

  cout << "Para cada alternativa digite: " << endl;
  cout << "(n) para o rebelde Nietzsche." << endl;
  cout << "(s) para o realista shopenhauer." << endl;
  cout << "(k) para o moralista Kant." << endl;
  cout << "(h) para o institucionalista Hegel." << endl;
  cin >> x;

  switch (x)
  {
  case (n):
    cout << "O Homem é uma ponte atada entre o animal e o super homem!";
    cout << "Uma ponte sob o abismo!!!" << endl;
    break;

  case (s):
    cout << "A solidão é a sorte de todos os espíritos excepcionais!!" << endl;
    break;

  case (k):
    cout << "Belo, é tudo quanto agrada desinteressadamente!!" << endl;
    break;

  case (h):
    cout << "Nada de grande se realizou no mundo sem paixão!!" << endl;
    break;

  default:
    cout << "Sua opção com certeza foi uma grande figura.";
    cout << "Mas não está cadastrada no sistema. Arriverdeci!" << endl;
    break;
  }
  return 0;
}